

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

void __thiscall
mapbox::detail::Earcut<long>::operator()
          (Earcut<long> *this,
          vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
          *points)

{
  pointer plVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer *ppMVar4;
  Node *outerNode;
  Node *pNVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  plVar1 = (this->indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar1) {
    (this->indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar1;
  }
  this->vertices = 0;
  pvVar2 = (points->
           super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (points->
           super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != pvVar3) {
    ppMVar4 = &(pvVar2->
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    iVar7 = 0x50;
    lVar9 = 0;
    uVar6 = 1;
    do {
      lVar8 = (long)*ppMVar4 - (long)((_Vector_impl_data *)(ppMVar4 + -1))->_M_start >> 4;
      lVar9 = lVar8 + lVar9;
      iVar7 = iVar7 - (int)lVar8;
      if (iVar7 < 0) break;
      ppMVar4 = ppMVar4 + 3;
      bVar10 = uVar6 < (ulong)(((long)pvVar3 - (long)pvVar2 >> 3) * -0x5555555555555555);
      uVar6 = uVar6 + 1;
    } while (bVar10);
    ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
    ::reset(&this->nodes,(ulong)(lVar9 * 3) >> 1);
    pvVar2 = (points->
             super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<long,_std::allocator<long>_>::reserve
              (&this->indices,
               ((long)*(pointer *)
                       ((long)&(pvVar2->
                               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                               )._M_impl.super__Vector_impl_data + 8) -
                *(long *)&(pvVar2->
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          )._M_impl.super__Vector_impl_data >> 4) + lVar9);
    outerNode = linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                          (this,(points->
                                super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,true);
    if (outerNode != (Node *)0x0) {
      if (1 < (ulong)(((long)(points->
                             super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(points->
                             super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
         ) {
        outerNode = eliminateHoles<std::vector<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>,std::allocator<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>>>
                              (this,points,outerNode);
      }
      this->hashing = SUB41((uint)iVar7 >> 0x1f,0);
      if (iVar7 < 0) {
        pNVar5 = outerNode->next;
        dVar13 = outerNode->x;
        this->maxX = dVar13;
        this->minX = dVar13;
        dVar11 = outerNode->y;
        this->maxY = dVar11;
        this->minY = dVar11;
        dVar15 = dVar11;
        dVar17 = dVar13;
        do {
          dVar14 = pNVar5->x;
          dVar12 = pNVar5->y;
          dVar18 = dVar14;
          if (dVar17 <= dVar14) {
            dVar18 = dVar17;
          }
          dVar16 = dVar12;
          if (dVar15 <= dVar12) {
            dVar16 = dVar15;
          }
          if (dVar14 <= dVar13) {
            dVar14 = dVar13;
          }
          if (dVar12 <= dVar11) {
            dVar12 = dVar11;
          }
          pNVar5 = pNVar5->next;
          dVar11 = dVar12;
          dVar13 = dVar14;
          dVar15 = dVar16;
          dVar17 = dVar18;
        } while (pNVar5 != outerNode);
        this->minX = dVar18;
        this->minY = dVar16;
        this->maxX = dVar14;
        this->maxY = dVar12;
        dVar13 = dVar12 - dVar16;
        if (dVar12 - dVar16 <= dVar14 - dVar18) {
          dVar13 = dVar14 - dVar18;
        }
        this->inv_size = (double)(-(ulong)(dVar13 != 0.0) & (ulong)(1.0 / dVar13));
      }
      earcutLinked(this,outerNode,0);
      ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
      ::reset(&this->nodes,(this->nodes).blockSize);
      return;
    }
  }
  return;
}

Assistant:

void Earcut<N>::operator()(const Polygon& points) {
    // reset
    indices.clear();
    vertices = 0;

    if (points.empty()) return;

    double x;
    double y;
    int threshold = 80;
    std::size_t len = 0;

    for (size_t i = 0; threshold >= 0 && i < points.size(); i++) {
        threshold -= static_cast<int>(points[i].size());
        len += points[i].size();
    }

    //estimate size of nodes and indices
    nodes.reset(len * 3 / 2);
    indices.reserve(len + points[0].size());

    Node* outerNode = linkedList(points[0], true);
    if (!outerNode) return;

    if (points.size() > 1) outerNode = eliminateHoles(points, outerNode);

    // if the shape is not too simple, we'll use z-order curve hash later; calculate polygon bbox
    hashing = threshold < 0;
    if (hashing) {
        Node* p = outerNode->next;
        minX = maxX = outerNode->x;
        minY = maxY = outerNode->y;
        do {
            x = p->x;
            y = p->y;
            minX = std::min<double>(minX, x);
            minY = std::min<double>(minY, y);
            maxX = std::max<double>(maxX, x);
            maxY = std::max<double>(maxY, y);
            p = p->next;
        } while (p != outerNode);

        // minX, minY and size are later used to transform coords into integers for z-order calculation
        inv_size = std::max<double>(maxX - minX, maxY - minY);
        inv_size = inv_size != .0 ? (1. / inv_size) : .0;
    }

    earcutLinked(outerNode);

    nodes.clear();
}